

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O2

bool isInlinedScript(TextFilePos *errorPos,char *script_name)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  reference pvVar5;
  
  iVar3 = strncmp(script_name,"[string \"script ",0x10);
  if (((iVar3 == 0) && (uVar4 = atoi(script_name + 0x10), -1 < (int)uVar4)) &&
     ((int)uVar4 <
      (int)(((long)scripts_origin.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)scripts_origin.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x18))) {
    pvVar5 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::at
                       (&scripts_origin,(ulong)uVar4);
    uVar1 = pvVar5->line;
    uVar2 = pvVar5->colBegin;
    errorPos->filename = pvVar5->filename;
    errorPos->line = uVar1;
    errorPos->colBegin = uVar2;
    errorPos->colEnd = pvVar5->colEnd;
    return true;
  }
  return false;
}

Assistant:

static bool isInlinedScript(TextFilePos & errorPos, const char* script_name) {
	// return false when the script is external (real file name)
	if (script_name != strstr(script_name, "[string \"script ")) return false;
	// inlined script, find it's origin and add line number to that
	int scriptNumber = atoi(script_name + 16);
	if (scriptNumber < 0 || int(scripts_origin.size()) <= scriptNumber) return false;
	errorPos = scripts_origin.at(scriptNumber);
	return true;
}